

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O2

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoLinear>::InitializeIntegrationRule
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoLinear> *this)

{
  long lVar1;
  int iVar2;
  int object;
  long lVar3;
  long *plVar4;
  ostream *poVar5;
  TPZGeoEl *pTVar6;
  long *plVar7;
  long lVar8;
  int order;
  TPZManVector<int,_3> orderdim;
  TPZStack<int,_10> ordervec;
  
  if ((this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements == 0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzmultiphysicscompel.cpp"
               ,0x44c);
  }
  lVar3 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xb8))(this)
  ;
  if ((lVar3 != 0) &&
     (plVar4 = (long *)__dynamic_cast(lVar3,&TPZMaterial::typeinfo,&TPZMatCombinedSpaces::typeinfo,
                                      0xfffffffffffffffe), plVar4 != (long *)0x0)) {
    lVar3 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
    pTVar6 = TPZCompEl::Reference((TPZCompEl *)this);
    iVar2 = (**(code **)(*(long *)pTVar6 + 0x210))(pTVar6);
    TPZStack<int,_10>::TPZStack(&ordervec);
    lVar8 = 0;
    if (lVar3 < 1) {
      lVar3 = lVar8;
    }
    while (lVar3 != 0) {
      if (((*(int *)((long)(this->super_TPZMultiphysicsElement).fActiveApproxSpace.super_TPZVec<int>
                           .fStore + lVar8) != 0) &&
          (lVar1 = *(long *)((long)&((this->fElementVec).super_TPZVec<TPZCompElSide>.fStore)->fEl +
                            lVar8 * 4), lVar1 != 0)) &&
         (plVar7 = (long *)__dynamic_cast(lVar1,&TPZCompEl::typeinfo,
                                          &TPZInterpolationSpace::typeinfo,0), plVar7 != (long *)0x0
         )) {
        object = (**(code **)(*plVar7 + 0x268))(plVar7);
        TPZStack<int,_10>::Push(&ordervec,object);
      }
      lVar8 = lVar8 + 4;
      lVar3 = lVar3 + -1;
    }
    order = (**(code **)(*plVar4 + 0x48))(plVar4,&ordervec);
    TPZManVector<int,_3>::TPZManVector(&orderdim,(long)iVar2,&order);
    TPZInt1d::SetOrder(&this->fIntRule,&orderdim.super_TPZVec<int>,0);
    TPZManVector<int,_3>::~TPZManVector(&orderdim);
    TPZManVector<int,_10>::~TPZManVector(&ordervec.super_TPZManVector<int,_10>);
    return;
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"Error at ");
  poVar5 = std::operator<<(poVar5,
                           "virtual void TPZMultiphysicsCompEl<pzgeom::TPZGeoLinear>::InitializeIntegrationRule() [TGeometry = pzgeom::TPZGeoLinear]"
                          );
  std::operator<<(poVar5," this->Material() == NULL\n");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzmultiphysicscompel.cpp"
             ,0x454);
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::InitializeIntegrationRule()
{
    if (fElementVec.NElements() == 0) {
        DebugStop(); // This case should be treated before
    }
    
    auto basemat = this->Material();
    auto *material =
        dynamic_cast<TPZMatCombinedSpaces*>(basemat);
    if(!material){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " this->Material() == NULL\n";
        DebugStop();
    }
    
    const int64_t nref = fElementVec.size();
    TPZGeoEl *gel = this->Reference();
    int dim = gel->Dimension();
    TPZStack<int> ordervec;
    for (int64_t iref=0;  iref<nref; iref++)
    {
        if(fActiveApproxSpace[iref] == 0){
            continue;
        }
        TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
        if(msp)
        {
            ordervec.Push(msp->MaxOrder());
        }
    }
    int order = material->IntegrationRuleOrder(ordervec);
    TPZManVector<int,3> orderdim(dim,order);
    fIntRule.SetOrder(orderdim);
    
}